

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8to1.h
# Opt level: O0

void ncnn::deconvolution_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  float *pfVar11;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar12;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  float local_7d4;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  int local_6c4;
  undefined8 *local_6c0;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined4 local_688;
  long local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined8 local_660;
  int local_654;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined4 local_638;
  long local_630;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined8 local_610;
  long local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 local_588;
  long local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined8 local_560;
  float *local_558;
  int local_54c;
  long local_548;
  int local_53c;
  int local_538;
  int local_534;
  int local_530;
  int local_52c;
  long *local_520;
  long *local_518;
  long *local_510;
  undefined1 local_505;
  int local_504;
  undefined8 *local_4f8;
  undefined8 *local_4e8;
  undefined8 *local_4d8;
  undefined8 *local_4c8;
  undefined8 *local_4b8;
  undefined8 *local_498;
  undefined8 *local_478;
  undefined8 *local_458;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 *local_410;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined1 local_3ed;
  int local_3ec;
  undefined8 *local_3e0;
  undefined1 local_3bd;
  int local_3bc;
  undefined8 *local_3b0;
  int local_38c;
  undefined8 *local_388;
  float local_37c;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  float local_360;
  float local_35c;
  long *local_358;
  int local_350;
  float local_34c [3];
  long *local_340;
  undefined8 local_338;
  long *local_330;
  undefined8 local_328;
  long *local_320;
  undefined8 local_318;
  long *local_310;
  undefined8 local_308;
  long *local_300;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  long local_2a8;
  undefined4 local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  long local_288;
  undefined4 local_27c;
  long local_278;
  float *local_270;
  undefined4 local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  ulong local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined1 local_50 [16];
  ulong local_40;
  undefined8 uStack_38;
  
  local_534 = (int)in_RSI[7];
  local_538 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_53c = dilation_w * (in_R9D + -1) + 1;
  local_548 = *in_RCX;
  local_530 = in_R9D;
  local_52c = in_R8D;
  local_520 = in_RDX;
  local_518 = in_RSI;
  local_510 = in_RDI;
  for (local_54c = 0; local_54c < local_534; local_54c = local_54c + 1) {
    local_4f8 = &local_5a0;
    local_25c = *(int *)((long)local_518 + 0x2c);
    local_260 = (int)local_518[6];
    local_264 = *(undefined4 *)((long)local_518 + 0x34);
    local_558 = (float *)(*local_518 + local_518[8] * (long)local_54c * local_518[2]);
    local_278 = local_518[2];
    local_27c = (undefined4)local_518[3];
    local_288 = local_518[4];
    local_258 = &local_5a0;
    local_248 = (long)local_25c * (long)local_260 * local_278;
    local_4b8 = &local_5a0;
    local_4e8 = &local_5a0;
    local_24c = 0x10;
    local_504 = local_54c;
    local_505 = 1;
    local_5a0 = 0;
    local_590 = 0;
    local_588 = 0;
    local_578 = 0;
    local_574 = 0;
    local_570 = 0;
    local_56c = 0;
    local_568 = 0;
    local_560 = 0;
    local_598 = 0;
    local_5b0 = local_52c * local_530;
    local_5b4 = *(int *)((long)local_510 + 0x2c);
    local_5b8 = (int)local_510[6];
    local_5bc = (int)local_510[7];
    local_5c0 = *(int *)((long)local_518 + 0x2c);
    local_5c4 = (int)local_518[6];
    local_458 = local_4e8;
    local_270 = local_558;
    local_580 = local_288;
    for (local_5c8 = 0; local_5c8 < local_5c4; local_5c8 = local_5c8 + 1) {
      for (local_5cc = 0; local_5cc < local_5c0; local_5cc = local_5cc + 1) {
        local_5d0 = 0.0;
        if (local_548 != 0) {
          local_5d0 = *(float *)(local_548 + (long)local_54c * 4);
        }
        local_3b0 = &local_650;
        local_2cc = *(int *)((long)local_520 + 0x2c);
        local_2d0 = (int)local_520[6];
        local_2d4 = *(undefined4 *)((long)local_520 + 0x34);
        local_2e0 = *local_520 + local_520[8] * (long)local_54c * local_520[2];
        local_2e8 = local_520[2];
        local_2ec = (undefined4)local_520[3];
        local_2f8 = local_520[4];
        local_2c8 = &local_650;
        local_228 = (long)local_2cc * (long)local_2d0 * local_2e8;
        local_410 = &local_650;
        local_4d8 = &local_650;
        local_22c = 0x10;
        local_3bc = local_54c;
        local_3bd = 1;
        uStack_428 = 0;
        uStack_430 = 0;
        uStack_438 = 0;
        local_440 = 0;
        uStack_5e8 = 0;
        uStack_5f0 = 0;
        uStack_5f8 = 0;
        local_600 = 0;
        local_650 = 0;
        local_640 = 0;
        local_638 = 0;
        local_628 = 0;
        local_624 = 0;
        local_620 = 0;
        local_61c = 0;
        local_618 = 0;
        local_610 = 0;
        local_648 = 0;
        local_608 = local_2e0;
        for (local_654 = 0; local_654 < local_5bc; local_654 = local_654 + 1) {
          local_3e0 = &local_6a0;
          local_294 = *(int *)((long)local_510 + 0x2c);
          local_298 = (int)local_510[6];
          local_29c = *(undefined4 *)((long)local_510 + 0x34);
          local_2a8 = *local_510 + local_510[8] * (long)local_654 * local_510[2];
          local_2b0 = local_510[2];
          local_2b4 = (undefined4)local_510[3];
          local_2c0 = local_510[4];
          local_290 = &local_6a0;
          local_238 = (long)local_294 * (long)local_298 * local_2b0;
          for (local_6a4 = 0; local_6a4 < local_530; local_6a4 = local_6a4 + 1) {
            local_6a8 = (local_5c8 + local_6a4 * dilation_w) - (local_53c + -1);
            if (((-1 < local_6a8) && (local_6a8 % stride_w == 0)) &&
               (local_6ac = local_6a8 / stride_w, local_6ac < local_5b8)) {
              for (local_6b0 = 0; local_6b0 < local_52c; local_6b0 = local_6b0 + 1) {
                local_6b4 = (local_5cc + local_6b0 * in_stack_00000008) - (local_538 + -1);
                if (((-1 < local_6b4) && (local_6b4 % dilation_h == 0)) &&
                   (local_6b8 = local_6b4 / dilation_h, local_6b8 < local_5b4)) {
                  local_388 = &local_6a0;
                  local_6c0 = (undefined8 *)
                              (local_2a8 + (long)local_294 * (long)local_6ac * local_2b0 +
                              (long)(local_6b8 << 3) * 4);
                  local_6c4 = local_6a4 * local_52c + local_6b0;
                  uVar2 = *local_6c0;
                  uVar3 = local_6c0[1];
                  uVar4 = local_6c0[2];
                  uVar5 = local_6c0[3];
                  local_400 = (undefined8 *)(local_608 + (long)(local_6c4 * 8) * 4);
                  local_720 = *local_400;
                  uStack_718 = local_400[1];
                  uStack_710 = local_400[2];
                  uStack_708 = local_400[3];
                  local_1c8 = &local_700;
                  local_1d0 = &local_720;
                  local_1d8 = &local_600;
                  local_700._0_4_ = (float)uVar2;
                  local_160 = (float)local_700;
                  local_700._4_4_ = (float)((ulong)uVar2 >> 0x20);
                  fStack_15c = local_700._4_4_;
                  uStack_6f8._0_4_ = (float)uVar3;
                  fStack_158 = (float)uStack_6f8;
                  uStack_6f8._4_4_ = (float)((ulong)uVar3 >> 0x20);
                  fStack_154 = uStack_6f8._4_4_;
                  uStack_6f0._0_4_ = (float)uVar4;
                  fStack_150 = (float)uStack_6f0;
                  uStack_6f0._4_4_ = (float)((ulong)uVar4 >> 0x20);
                  fStack_14c = uStack_6f0._4_4_;
                  uStack_6e8._0_4_ = (float)uVar5;
                  fStack_148 = (float)uStack_6e8;
                  uStack_6e8._4_4_ = (float)((ulong)uVar5 >> 0x20);
                  fStack_144 = uStack_6e8._4_4_;
                  local_180._0_4_ = (float)local_720;
                  local_180._4_4_ = (float)((ulong)local_720 >> 0x20);
                  uStack_178._0_4_ = (float)uStack_718;
                  uStack_178._4_4_ = (float)((ulong)uStack_718 >> 0x20);
                  uStack_170._0_4_ = (float)uStack_710;
                  uStack_170._4_4_ = (float)((ulong)uStack_710 >> 0x20);
                  uStack_168._0_4_ = (float)uStack_708;
                  local_1a0._4_4_ = local_700._4_4_ * local_180._4_4_;
                  local_1a0._0_4_ = (float)local_700 * (float)local_180;
                  local_1a0._8_4_ = (float)uStack_6f8 * (float)uStack_178;
                  local_1a0._12_4_ = uStack_6f8._4_4_ * uStack_178._4_4_;
                  local_1a0._16_4_ = (float)uStack_6f0 * (float)uStack_170;
                  local_1a0._20_4_ = uStack_6f0._4_4_ * uStack_170._4_4_;
                  local_1a0._24_4_ = (float)uStack_6e8 * (float)uStack_168;
                  local_1a0._28_4_ = uStack_6e8._4_4_;
                  uVar6 = local_600;
                  uVar7 = uStack_5f8;
                  uVar8 = uStack_5f0;
                  uVar9 = uStack_5e8;
                  local_1c0._0_4_ = (float)local_600;
                  local_1c0._4_4_ = (float)((ulong)local_600 >> 0x20);
                  uStack_1b8._0_4_ = (float)uStack_5f8;
                  uStack_1b8._4_4_ = (float)((ulong)uStack_5f8 >> 0x20);
                  uStack_1b0._0_4_ = (float)uStack_5f0;
                  uStack_1b0._4_4_ = (float)((ulong)uStack_5f0 >> 0x20);
                  uStack_1a8._0_4_ = (float)uStack_5e8;
                  uStack_1a8._4_4_ = (float)((ulong)uStack_5e8 >> 0x20);
                  local_600 = CONCAT44(local_700._4_4_ * local_180._4_4_ + local_1c0._4_4_,
                                       (float)local_700 * (float)local_180 + (float)local_1c0);
                  uStack_5f8 = CONCAT44(uStack_6f8._4_4_ * uStack_178._4_4_ + uStack_1b8._4_4_,
                                        (float)uStack_6f8 * (float)uStack_178 + (float)uStack_1b8);
                  uStack_5f0 = CONCAT44(uStack_6f0._4_4_ * uStack_170._4_4_ + uStack_1b0._4_4_,
                                        (float)uStack_6f0 * (float)uStack_170 + (float)uStack_1b0);
                  uStack_5e8 = CONCAT44(uStack_6e8._4_4_ + uStack_1a8._4_4_,
                                        (float)uStack_6e8 * (float)uStack_168 + (float)uStack_1a8);
                  local_700 = uVar2;
                  uStack_6f8 = uVar3;
                  uStack_6f0 = uVar4;
                  uStack_6e8 = uVar5;
                  local_3f8 = local_6c0;
                  local_38c = local_6ac;
                  local_1c0 = uVar6;
                  uStack_1b8 = uVar7;
                  uStack_1b0 = uVar8;
                  uStack_1a8 = uVar9;
                  local_180 = local_720;
                  uStack_178 = uStack_718;
                  uStack_170 = uStack_710;
                  uStack_168 = uStack_708;
                }
              }
            }
          }
          local_608 = local_608 + (long)(local_5b0 << 3) * 4;
          local_4c8 = &local_6a0;
          local_23c = 0x10;
          local_3ec = local_654;
          local_3ed = 1;
          local_6a0 = 0;
          local_690 = 0;
          local_688 = 0;
          local_678 = 0;
          local_674 = 0;
          local_670 = 0;
          local_66c = 0;
          local_668 = 0;
          local_660 = 0;
          local_698 = 0;
          local_498 = local_4c8;
          local_680 = local_2c0;
        }
        local_100 = local_600;
        uStack_f8 = uStack_5f8;
        uStack_f0 = uStack_5f0;
        uStack_e8 = uStack_5e8;
        local_a0 = local_600;
        uStack_98 = uStack_5f8;
        uStack_90 = uStack_5f0;
        uStack_88 = uStack_5e8;
        local_b0 = uStack_5f0;
        uVar4 = local_b0;
        uStack_a8 = uStack_5e8;
        uVar5 = uStack_a8;
        local_c0 = local_600;
        uVar2 = local_c0;
        uStack_b8 = uStack_5f8;
        uVar3 = uStack_b8;
        local_b0._0_4_ = (float)uStack_5f0;
        local_b0._4_4_ = (float)((ulong)uStack_5f0 >> 0x20);
        uStack_a8._0_4_ = (float)uStack_5e8;
        uStack_a8._4_4_ = (float)((ulong)uStack_5e8 >> 0x20);
        local_c0._0_4_ = (float)local_600;
        local_c0._4_4_ = (float)((ulong)local_600 >> 0x20);
        uStack_b8._0_4_ = (float)uStack_5f8;
        uStack_b8._4_4_ = (float)((ulong)uStack_5f8 >> 0x20);
        local_110 = (float)local_b0 + (float)local_c0;
        fStack_10c = local_b0._4_4_ + local_c0._4_4_;
        fStack_108 = (float)uStack_a8 + (float)uStack_b8;
        fStack_104 = uStack_a8._4_4_ + uStack_b8._4_4_;
        local_d0 = CONCAT44(fStack_10c,local_110);
        uStack_c8 = CONCAT44(fStack_104,fStack_108);
        auVar10._8_8_ = uStack_c8;
        auVar10._0_8_ = local_d0;
        auVar1._8_8_ = uStack_c8;
        auVar1._0_8_ = local_d0;
        _local_e0 = vunpckhpd_avx(auVar1,auVar10);
        local_120 = local_110 + (float)local_e0._0_4_;
        fStack_11c = fStack_10c + (float)local_e0._4_4_;
        fStack_118 = fStack_108 + fStack_d8;
        fStack_114 = fStack_104 + fStack_d4;
        local_50._0_4_ = local_120 + fStack_11c;
        local_50._4_4_ = 0;
        local_130 = local_50._0_8_;
        uStack_128 = 0;
        local_40 = local_50._0_8_;
        uStack_38 = 0;
        local_7d4 = local_5d0 + (float)local_50._0_4_;
        local_358 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_350 = stride_h;
        local_34c[0] = local_7d4;
        local_5d0 = local_7d4;
        local_478 = local_4d8;
        local_c0 = uVar2;
        uStack_b8 = uVar3;
        local_b0 = uVar4;
        uStack_a8 = uVar5;
        local_80 = local_d0;
        uStack_78 = uStack_c8;
        local_70 = local_d0;
        uStack_68 = uStack_c8;
        local_60 = fStack_11c;
        fStack_5c = fStack_11c;
        fStack_58 = fStack_11c;
        fStack_54 = fStack_11c;
        local_50 = ZEXT416((uint)local_50._0_4_);
        local_630 = local_2f8;
        switch(stride_h) {
        case 1:
          auVar1 = vmaxss_avx(ZEXT416((uint)local_7d4),ZEXT816(0));
          local_34c[0] = auVar1._0_4_;
          break;
        case 2:
          local_308 = 0;
          local_35c = *(float *)*local_358;
          if (local_7d4 <= 0.0) {
            local_7d4 = local_7d4 * local_35c;
          }
          local_34c[0] = local_7d4;
          local_300 = local_358;
          break;
        case 3:
          local_318 = 0;
          local_360 = *(float *)*local_358;
          local_328 = 1;
          local_364 = *(float *)(*local_358 + 4);
          if (local_7d4 < local_360) {
            local_34c[0] = local_360;
          }
          local_320 = local_358;
          local_310 = local_358;
          if (local_364 < local_34c[0]) {
            local_34c[0] = local_364;
          }
          break;
        case 4:
          local_368 = 88.37626;
          pfVar11 = std::min<float>(local_34c,&local_368);
          local_34c[0] = *pfVar11;
          local_36c = -88.37626;
          pfVar11 = std::max<float>(local_34c,&local_36c);
          local_34c[0] = *pfVar11;
          fVar12 = expf(-local_34c[0]);
          local_34c[0] = 1.0 / (fVar12 + 1.0);
          break;
        case 5:
          fVar12 = expf(local_7d4);
          fVar12 = logf(fVar12 + 1.0);
          local_34c[0] = tanhf(fVar12);
          local_34c[0] = local_7d4 * local_34c[0];
          break;
        case 6:
          local_338 = 0;
          local_370 = *(float *)*local_358;
          local_34c[1] = 1.4013e-45;
          local_34c[2] = 0.0;
          local_374 = *(float *)(*local_358 + 4);
          local_378 = -local_374 / local_370;
          local_37c = 1.0 / local_370 + local_378;
          local_340 = local_358;
          local_330 = local_358;
          if (local_378 <= local_7d4) {
            if (local_7d4 <= local_37c) {
              local_34c[0] = local_7d4 * (local_7d4 * local_370 + local_374);
            }
          }
          else {
            local_34c[0] = 0.0;
          }
        }
        *local_558 = local_34c[0];
        local_558 = local_558 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m256 _sum = _mm256_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = y * kernel_w + x;

                            __m256 _val = _mm256_load_ps(sptr);
                            __m256 _w = _mm256_load_ps(kptr + k * 8);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 8;
                }

                sum += _mm256_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}